

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<unsigned_int> __thiscall kj::consumeNumber(kj *this,char **ptr)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  
  pcVar1 = skipSpace(*ptr);
  iVar3 = 0;
  for (lVar2 = 0; (byte)(pcVar1[lVar2] - 0x30U) < 10; lVar2 = lVar2 + 1) {
    iVar3 = iVar3 * 10 + (uint)(byte)pcVar1[lVar2] + -0x30;
  }
  if (lVar2 != 0) {
    *ptr = pcVar1 + lVar2;
    *(int *)(this + 4) = iVar3;
  }
  *this = (kj)(lVar2 != 0);
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static kj::Maybe<uint> consumeNumber(const char*& ptr) {
  const char* start = skipSpace(ptr);
  const char* p = start;

  uint result = 0;

  for (;;) {
    const char c = *p;
    if ('0' <= c && c <= '9') {
      result = result * 10 + (c - '0');
      ++p;
    } else {
      if (p == start) return kj::none;
      ptr = p;
      return result;
    }
  }
}